

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int event_assign(event *ev,event_base *base,int fd,short events,
                _func_void_int_short_void_ptr *callback,void *arg)

{
  event *local_38;
  void *arg_local;
  _func_void_int_short_void_ptr *callback_local;
  short events_local;
  event_base *peStack_20;
  int fd_local;
  event_base *base_local;
  event *ev_local;
  
  peStack_20 = base;
  if (base == (event_base *)0x0) {
    peStack_20 = event_global_current_base_;
  }
  local_38 = (event *)arg;
  if ((void **)arg == &event_self_cbarg_ptr_) {
    local_38 = ev;
  }
  if ((events & 8U) == 0) {
    event_debug_assert_socket_nonblocking_(fd);
  }
  event_debug_assert_not_added_(ev);
  ev->ev_base = peStack_20;
  (ev->ev_evcallback).evcb_cb_union.evcb_callback = callback;
  (ev->ev_evcallback).evcb_arg = local_38;
  ev->ev_fd = fd;
  ev->ev_events = events;
  ev->ev_res = 0;
  (ev->ev_evcallback).evcb_flags = 0x80;
  (ev->ev_).ev_signal.ev_ncalls = 0;
  (ev->ev_).ev_io.ev_timeout.tv_usec = 0;
  if ((events & 8U) == 0) {
    if ((events & 0x10U) == 0) {
      (ev->ev_evcallback).evcb_closure = '\0';
    }
    else {
      (ev->ev_).ev_io.ev_timeout.tv_usec = 0;
      (ev->ev_).ev_io.ev_timeout.tv_sec = 0;
      (ev->ev_evcallback).evcb_closure = '\x02';
    }
  }
  else {
    if ((events & 0x86U) != 0) {
      event_warnx("%s: EV_SIGNAL is not compatible with EV_READ, EV_WRITE or EV_CLOSED",
                  "event_assign");
      return -1;
    }
    (ev->ev_evcallback).evcb_closure = '\x01';
  }
  min_heap_elem_init_(ev);
  if (peStack_20 != (event_base *)0x0) {
    (ev->ev_evcallback).evcb_pri = (uint8_t)((long)peStack_20->nactivequeues / 2);
  }
  event_debug_note_setup_(ev);
  return 0;
}

Assistant:

int
event_assign(struct event *ev, struct event_base *base, evutil_socket_t fd, short events, void (*callback)(evutil_socket_t, short, void *), void *arg)
{
	if (!base)
		base = current_base;
	if (arg == &event_self_cbarg_ptr_)
		arg = ev;

	if (!(events & EV_SIGNAL))
		event_debug_assert_socket_nonblocking_(fd);
	event_debug_assert_not_added_(ev);

	ev->ev_base = base;

	ev->ev_callback = callback;
	ev->ev_arg = arg;
	ev->ev_fd = fd;
	ev->ev_events = events;
	ev->ev_res = 0;
	ev->ev_flags = EVLIST_INIT;
	ev->ev_ncalls = 0;
	ev->ev_pncalls = NULL;

	if (events & EV_SIGNAL) {
		if ((events & (EV_READ|EV_WRITE|EV_CLOSED)) != 0) {
			event_warnx("%s: EV_SIGNAL is not compatible with "
			    "EV_READ, EV_WRITE or EV_CLOSED", __func__);
			return -1;
		}
		ev->ev_closure = EV_CLOSURE_EVENT_SIGNAL;
	} else {
		if (events & EV_PERSIST) {
			evutil_timerclear(&ev->ev_io_timeout);
			ev->ev_closure = EV_CLOSURE_EVENT_PERSIST;
		} else {
			ev->ev_closure = EV_CLOSURE_EVENT;
		}
	}

	min_heap_elem_init_(ev);

	if (base != NULL) {
		/* by default, we put new events into the middle priority */
		ev->ev_pri = base->nactivequeues / 2;
	}

	event_debug_note_setup_(ev);

	return 0;
}